

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_font_atlas_cleanup(nk_font_atlas *atlas)

{
  nk_handle nVar1;
  nk_plugin_free p_Var2;
  nk_font_config *iter;
  nk_font_config *pnVar3;
  nk_font_config *pnVar4;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x35d7,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x35d8,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x35d9,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x35da,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x35db,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  pnVar3 = atlas->config;
  if (pnVar3 != (nk_font_config *)0x0) {
    for (; pnVar4 = pnVar3, pnVar3 != (nk_font_config *)0x0; pnVar3 = pnVar3->next) {
      while( true ) {
        pnVar4 = pnVar4->n;
        nVar1 = (atlas->permanent).userdata;
        p_Var2 = (atlas->permanent).free;
        if (pnVar4 == pnVar3) break;
        (*p_Var2)(nVar1,pnVar4->ttf_blob);
        pnVar4->ttf_blob = (void *)0x0;
      }
      (*p_Var2)(nVar1,pnVar3->ttf_blob);
      pnVar3->ttf_blob = (void *)0x0;
    }
  }
  return;
}

Assistant:

NK_API void
nk_font_atlas_cleanup(struct nk_font_atlas *atlas)
{
    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);
    if (!atlas || !atlas->permanent.alloc || !atlas->permanent.free) return;
    if (atlas->config) {
        struct nk_font_config *iter;
        for (iter = atlas->config; iter; iter = iter->next) {
            struct nk_font_config *i;
            for (i = iter->n; i != iter; i = i->n) {
                atlas->permanent.free(atlas->permanent.userdata, i->ttf_blob);
                i->ttf_blob = 0;
            }
            atlas->permanent.free(atlas->permanent.userdata, iter->ttf_blob);
            iter->ttf_blob = 0;
        }
    }
}